

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O1

void __thiscall
llvm::DWARFContext::addLocalsForDie
          (DWARFContext *this,DWARFCompileUnit *CU,DWARFDie Subprogram,DWARFDie Die,
          vector<llvm::DILocal,_std::allocator<llvm::DILocal>_> *Result)

{
  byte bVar1;
  DWARFAbbreviationDeclaration *pDVar2;
  DWARFUnit *pDVar3;
  undefined8 uVar4;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar5;
  DWARFAbbreviationDeclaration *AbbrevDecl;
  ulong uVar6;
  LineTable *pLVar7;
  char *pcVar8;
  size_t sVar9;
  uint uVar10;
  ulong uVar11;
  uint64_t PointerSize;
  uchar *puVar12;
  Optional<const_char_*> OVar13;
  Optional<unsigned_long> OVar14;
  DWARFDie DVar15;
  StringRef CompDir;
  undefined1 local_140 [8];
  Optional<llvm::ArrayRef<unsigned_char>_> Location;
  iterator __begin1;
  _Alloc_hider local_108;
  char *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  string local_e8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_c8;
  ulong local_c0;
  char local_b8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_b0;
  undefined1 local_a8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_a0;
  undefined1 local_98;
  undefined1 local_90 [8];
  Optional<llvm::DWARFFormValue> NameAttr;
  DWARFDie local_50;
  DWARFDie local_40;
  
  NameAttr.Storage._48_8_ = CU;
  local_50 = Subprogram;
  local_40 = Die;
  if ((Die.U == (DWARFUnit *)0x0) || (Die.Die == (DWARFDebugInfoEntry *)0x0)) {
    __assert_fail("isValid() && \"must check validity prior to calling\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFDie.h"
                  ,0x3b,
                  "const DWARFAbbreviationDeclaration *llvm::DWARFDie::getAbbreviationDeclarationPtr() const"
                 );
  }
  pDVar2 = (Die.Die)->AbbrevDecl;
  if (pDVar2 == (DWARFAbbreviationDeclaration *)0x0) goto LAB_00af0713;
  if (pDVar2->Tag != DW_TAG_variable) {
    if (pDVar2 == (DWARFAbbreviationDeclaration *)0x0) {
LAB_00af0713:
      join_0x00000010_0x00000000_ = DWARFDie::getFirstChild(&local_40);
      DVar15 = DWARFDie::getLastChild(&local_40);
      uVar4 = NameAttr.Storage._48_8_;
      if (DVar15 != stack0xfffffffffffffed8) {
        do {
          addLocalsForDie(this,(DWARFCompileUnit *)uVar4,local_50,stack0xfffffffffffffed8,Result);
          join_0x00000010_0x00000000_ = DWARFDie::getSibling((DWARFDie *)&Location.Storage.hasVal);
        } while (SUB168((undefined1  [16])DVar15 ^ (undefined1  [16])join_0x00000010_0x00000000_,0)
                 != 0 || SUB168((undefined1  [16])DVar15 ^
                                (undefined1  [16])join_0x00000010_0x00000000_,8) != 0);
      }
      return;
    }
    if (pDVar2->Tag != DW_TAG_formal_parameter) {
      if (((pDVar2 != (DWARFAbbreviationDeclaration *)0x0) &&
          (pDVar2->Tag == DW_TAG_inlined_subroutine)) &&
         (DVar15 = DWARFDie::getAttributeValueAsReferencedDie(&local_40,DW_AT_abstract_origin),
         DVar15.Die != (DWARFDebugInfoEntry *)0x0 && DVar15.U != (DWARFUnit *)0x0)) {
        local_50 = DVar15;
      }
      goto LAB_00af0713;
    }
  }
  __begin1.Die.U = (DWARFUnit *)0x0;
  Location.Storage._16_8_ = &__begin1.Die.Die;
  __begin1.Die.Die._0_1_ = 0;
  local_108._M_p = (pointer)&local_f8;
  local_100 = (char *)0x0;
  local_f8._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_c8.value = 0;
  local_c0 = local_c0 & 0xffffffffffffff00;
  local_b8 = '\0';
  local_b0.value = local_b0.value & 0xffffffffffffff00;
  local_a8 = 0;
  local_a0.value = local_a0.value & 0xffffffffffffff00;
  local_98 = 0;
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,&local_50,DW_AT_name);
  uVar4 = NameAttr.Storage._48_8_;
  if (NameAttr.Storage.field_0._40_1_ == '\x01') {
    OVar13 = DWARFFormValue::getAsCString((DWARFFormValue *)local_90);
    if (((undefined1  [16])OVar13.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pDVar3 = __begin1.Die.U;
      strlen(OVar13.Storage.field_0.value);
      std::__cxx11::string::_M_replace
                ((ulong)&Location.Storage.hasVal,0,(char *)pDVar3,(ulong)OVar13.Storage.field_0);
    }
  }
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,&local_40,DW_AT_location);
  if ((((NameAttr.Storage.field_0._40_1_ == '\x01') &&
       (DWARFFormValue::getAsBlock
                  ((Optional<llvm::ArrayRef<unsigned_char>_> *)local_140,(DWARFFormValue *)local_90)
       , Location.Storage.field_0.value.Length._0_1_ == '\x01')) &&
      (Location.Storage.field_0.value.Data != (uchar *)0x0)) && (*(uchar *)local_140 == 0x91)) {
    local_c0 = 0;
    puVar12 = (uchar *)0x1;
    uVar6 = 0;
    uVar10 = 0;
    do {
      if (Location.Storage.field_0.value.Data == puVar12) goto LAB_00af05b6;
      bVar1 = *(byte *)((long)local_140 + (long)puVar12);
      uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)uVar10 & 0x3f);
      uVar10 = uVar10 + 7;
      puVar12 = puVar12 + 1;
    } while ((char)bVar1 < '\0');
    uVar11 = -1L << ((byte)uVar10 & 0x3f);
    if (bVar1 < 0x40) {
      uVar11 = 0;
    }
    if (0x3f < uVar10) {
      uVar11 = 0;
    }
    local_c0 = uVar6 | uVar11;
LAB_00af05b6:
    if (local_b8 == '\0') {
      local_b8 = '\x01';
    }
  }
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,&local_40,DW_AT_LLVM_tag_offset);
  if (NameAttr.Storage.field_0._40_1_ == '\x01') {
    OVar14 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_90);
    local_a0 = OVar14.Storage.field_0;
    local_98 = OVar14.Storage.hasVal;
  }
  DVar15 = DWARFDie::getAttributeValueAsReferencedDie(&local_40,DW_AT_abstract_origin);
  if (DVar15.Die != (DWARFDebugInfoEntry *)0x0 && DVar15.U != (DWARFUnit *)0x0) {
    local_40 = DVar15;
  }
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,&local_40,DW_AT_name);
  if (NameAttr.Storage.field_0._40_1_ == '\x01') {
    OVar13 = DWARFFormValue::getAsCString((DWARFFormValue *)local_90);
    pcVar8 = local_100;
    if (((undefined1  [16])OVar13.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      strlen(OVar13.Storage.field_0.value);
      std::__cxx11::string::_M_replace((ulong)&local_108,0,pcVar8,(ulong)OVar13.Storage.field_0);
    }
  }
  DVar15 = DWARFDie::getAttributeValueAsReferencedDie(&local_40,DW_AT_type);
  if (DVar15.Die != (DWARFDebugInfoEntry *)0x0 && DVar15.U != (DWARFUnit *)0x0) {
    parseNormalUnits(this);
    uVar10 = (this->NormalUnits).NumInfoUnits;
    if (uVar10 == 0xffffffff) {
      uVar10 = (this->NormalUnits).
               super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
               .
               super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
               .
               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               .
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               .super_SmallVectorBase.Size;
    }
    if (uVar10 == 0) {
      PointerSize = 0;
    }
    else {
      PointerSize = (uint64_t)
                    *(byte *)(*(this->NormalUnits).
                               super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                               .
                               super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
                               .
                               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                               .
                               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                               .super_SmallVectorBase.BeginX + 0x22);
    }
    OVar14 = getTypeSize(DVar15,PointerSize);
    local_b0 = OVar14.Storage.field_0;
    local_a8 = OVar14.Storage.hasVal;
  }
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,&local_40,DW_AT_decl_file);
  if ((NameAttr.Storage.field_0._40_1_ == '\x01') &&
     (pLVar7 = getLineTableForUnit(*(DWARFContext **)(uVar4 + 8),(DWARFUnit *)uVar4),
     pLVar7 != (LineTable *)0x0)) {
    if (NameAttr.Storage.field_0._40_1_ == '\0') {
      pcVar8 = 
      "T &llvm::optional_detail::OptionalStorage<llvm::DWARFFormValue>::getValue() & [T = llvm::DWARFFormValue]"
      ;
      goto LAB_00af0987;
    }
    OVar14 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_90);
    if (((undefined1  [16])OVar14.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar8 = DWARFUnit::getCompilationDir((DWARFUnit *)uVar4);
      if (pcVar8 == (char *)0x0) {
        sVar9 = 0;
      }
      else {
        sVar9 = strlen(pcVar8);
      }
      CompDir.Length = sVar9;
      CompDir.Data = pcVar8;
      DWARFDebugLine::Prologue::getFileNameByIndex
                (&pLVar7->Prologue,OVar14.Storage.field_0.value,CompDir,AbsoluteFilePath,&local_e8,
                 native);
      goto LAB_00af087d;
    }
  }
  else {
LAB_00af087d:
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,&local_40,DW_AT_decl_line);
    aVar5 = local_c8;
    if (NameAttr.Storage.field_0._40_1_ != '\x01') {
LAB_00af08b4:
      local_c8 = aVar5;
      std::vector<llvm::DILocal,_std::allocator<llvm::DILocal>_>::push_back
                (Result,(value_type *)&Location.Storage.hasVal);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                 local_e8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,
                        CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) + 1)
        ;
      }
      if ((DWARFDebugInfoEntry **)Location.Storage._16_8_ == &__begin1.Die.Die) {
        return;
      }
      operator_delete((void *)Location.Storage._16_8_,
                      CONCAT71(__begin1.Die.Die._1_7_,__begin1.Die.Die._0_1_) + 1);
      return;
    }
    OVar14 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_90);
    aVar5.value = OVar14.Storage.field_0.value;
    if (((undefined1  [16])OVar14.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_00af08b4;
  }
  pcVar8 = 
  "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]";
LAB_00af0987:
  __assert_fail("hasVal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                ,0xad,pcVar8);
}

Assistant:

void DWARFContext::addLocalsForDie(DWARFCompileUnit *CU, DWARFDie Subprogram,
                                   DWARFDie Die, std::vector<DILocal> &Result) {
  if (Die.getTag() == DW_TAG_variable ||
      Die.getTag() == DW_TAG_formal_parameter) {
    DILocal Local;
    if (auto NameAttr = Subprogram.find(DW_AT_name))
      if (Optional<const char *> Name = NameAttr->getAsCString())
        Local.FunctionName = *Name;
    if (auto LocationAttr = Die.find(DW_AT_location))
      if (Optional<ArrayRef<uint8_t>> Location = LocationAttr->getAsBlock())
        if (!Location->empty() && (*Location)[0] == DW_OP_fbreg)
          Local.FrameOffset =
              decodeSLEB128(Location->data() + 1, nullptr, Location->end());
    if (auto TagOffsetAttr = Die.find(DW_AT_LLVM_tag_offset))
      Local.TagOffset = TagOffsetAttr->getAsUnsignedConstant();

    if (auto Origin =
            Die.getAttributeValueAsReferencedDie(DW_AT_abstract_origin))
      Die = Origin;
    if (auto NameAttr = Die.find(DW_AT_name))
      if (Optional<const char *> Name = NameAttr->getAsCString())
        Local.Name = *Name;
    if (auto Type = Die.getAttributeValueAsReferencedDie(DW_AT_type))
      Local.Size = getTypeSize(Type, getCUAddrSize());
    if (auto DeclFileAttr = Die.find(DW_AT_decl_file)) {
      if (const auto *LT = CU->getContext().getLineTableForUnit(CU))
        LT->getFileNameByIndex(
            DeclFileAttr->getAsUnsignedConstant().getValue(),
            CU->getCompilationDir(),
            DILineInfoSpecifier::FileLineInfoKind::AbsoluteFilePath,
            Local.DeclFile);
    }
    if (auto DeclLineAttr = Die.find(DW_AT_decl_line))
      Local.DeclLine = DeclLineAttr->getAsUnsignedConstant().getValue();

    Result.push_back(Local);
    return;
  }

  if (Die.getTag() == DW_TAG_inlined_subroutine)
    if (auto Origin =
            Die.getAttributeValueAsReferencedDie(DW_AT_abstract_origin))
      Subprogram = Origin;

  for (auto Child : Die)
    addLocalsForDie(CU, Subprogram, Child, Result);
}